

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O1

void Gia_ManFraSupports(Gia_ManFra_t *p)

{
  int iVar1;
  Gia_ParFra_t *pGVar2;
  Gia_Man_t *pGVar3;
  undefined8 uVar4;
  bool bVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  void **__s;
  Vec_Int_t *p_00;
  Vec_Int_t *vSupp;
  int *piVar8;
  Vec_Int_t *vNodes;
  int iVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  
  pGVar2 = p->pPars;
  iVar1 = pGVar2->nFrames;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = iVar1;
  if (iVar1 - 1U < 7) {
    iVar9 = 8;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    ppvVar7 = (void **)0x0;
  }
  else {
    ppvVar7 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar6->pArray = ppvVar7;
  pVVar6->nSize = iVar1;
  __s = (void **)0x0;
  memset(ppvVar7,0,(long)iVar1 << 3);
  p->vIns = pVVar6;
  iVar1 = pGVar2->nFrames;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar1 - 1U) {
    iVar9 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 != 0) {
    __s = (void **)malloc((long)iVar9 << 3);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  ppvVar7 = (void **)0x0;
  memset(__s,0,(long)iVar1 << 3);
  p->vAnds = pVVar6;
  iVar1 = pGVar2->nFrames;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  iVar9 = 8;
  if (6 < iVar1 - 1U) {
    iVar9 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 != 0) {
    ppvVar7 = (void **)malloc((long)iVar9 << 3);
  }
  pVVar6->pArray = ppvVar7;
  pVVar6->nSize = iVar1;
  memset(ppvVar7,0,(long)iVar1 << 3);
  p->vOuts = pVVar6;
  Gia_ManIncrementTravId(p->pAig);
  lVar12 = (long)p->pPars->nFrames;
  if (0 < lVar12) {
    vSupp = (Vec_Int_t *)0x0;
    do {
      p_00 = Gia_ManCollectPoIds(p->pAig);
      if ((vSupp != (Vec_Int_t *)0x0) && (0 < vSupp->nSize)) {
        lVar11 = 0;
        do {
          iVar1 = vSupp->pArray[lVar11];
          if ((long)iVar1 < 0) {
LAB_00739cb3:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar3 = p->pAig;
          if (pGVar3->nObjs <= iVar1) goto LAB_00739cb3;
          if (pGVar3->pObjs == (Gia_Obj_t *)0x0) break;
          uVar4 = *(undefined8 *)(pGVar3->pObjs + iVar1);
          if ((((uint)uVar4 & 0x9fffffff) == 0x9fffffff) &&
             (uVar10 = (uint)((ulong)uVar4 >> 0x20),
             pGVar3->vCis->nSize - pGVar3->nRegs <= (int)(uVar10 & 0x1fffffff))) {
            uVar10 = uVar10 & 0x1fffffff;
            iVar1 = pGVar3->vCis->nSize;
            if ((int)uVar10 < iVar1 - pGVar3->nRegs) {
              __assert_fail("Gia_ObjIsRo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar9 = pGVar3->vCos->nSize;
            uVar10 = (iVar9 - iVar1) + uVar10;
            if (((int)uVar10 < 0) || (iVar9 <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar1 = pGVar3->vCos->pArray[uVar10];
            if ((iVar1 < 0) || (pGVar3->nObjs <= iVar1)) goto LAB_00739cb3;
            Vec_IntPush(p_00,iVar1);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < vSupp->nSize);
      }
      vSupp = (Vec_Int_t *)malloc(0x10);
      vSupp->nCap = 100;
      vSupp->nSize = 0;
      piVar8 = (int *)malloc(400);
      vSupp->pArray = piVar8;
      Gia_ManCollectCis(p->pAig,p_00->pArray,p_00->nSize,vSupp);
      vNodes = (Vec_Int_t *)malloc(0x10);
      vNodes->nCap = 100;
      vNodes->nSize = 0;
      piVar8 = (int *)malloc(400);
      vNodes->pArray = piVar8;
      Gia_ManCollectAnds(p->pAig,p_00->pArray,p_00->nSize,vNodes,(Vec_Int_t *)0x0);
      if (p->vIns->nSize < lVar12) {
LAB_00739cf1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      lVar11 = lVar12 + -1;
      p->vIns->pArray[lVar11] = vSupp;
      if (p->vAnds->nSize < lVar12) goto LAB_00739cf1;
      p->vAnds->pArray[lVar11] = vNodes;
      if (p->vOuts->nSize < lVar12) goto LAB_00739cf1;
      p->vOuts->pArray[lVar11] = p_00;
      bVar5 = 1 < lVar12;
      lVar12 = lVar11;
    } while (bVar5);
  }
  return;
}

Assistant:

void Gia_ManFraSupports( Gia_ManFra_t * p )
{
    Vec_Int_t * vIns = NULL, * vAnds, * vOuts;
    Gia_Obj_t * pObj;
    int f, i;
    p->vIns  = Vec_PtrStart( p->pPars->nFrames );
    p->vAnds = Vec_PtrStart( p->pPars->nFrames );
    p->vOuts = Vec_PtrStart( p->pPars->nFrames );
    Gia_ManIncrementTravId( p->pAig );
    for ( f = p->pPars->nFrames - 1; f >= 0; f-- )
    {
        vOuts = Gia_ManCollectPoIds( p->pAig );
        if ( vIns )
        Gia_ManForEachObjVec( vIns, p->pAig, pObj, i )
            if ( Gia_ObjIsRo(p->pAig, pObj) )
                Vec_IntPush( vOuts, Gia_ObjId( p->pAig, Gia_ObjRoToRi(p->pAig, pObj) ) );
        vIns = Vec_IntAlloc( 100 );
        Gia_ManCollectCis( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vIns );
        vAnds = Vec_IntAlloc( 100 );
        Gia_ManCollectAnds( p->pAig, Vec_IntArray(vOuts), Vec_IntSize(vOuts), vAnds, NULL );
        Vec_PtrWriteEntry( p->vIns,  f, vIns );
        Vec_PtrWriteEntry( p->vAnds, f, vAnds );
        Vec_PtrWriteEntry( p->vOuts, f, vOuts );
    }
}